

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O1

void print_program_ast(FILE *out,Program *program)

{
  Queue_Node *pQVar1;
  
  for (pQVar1 = program->translation_units->first; pQVar1 != (Queue_Node *)0x0;
      pQVar1 = pQVar1->prev) {
    fwrite("TRANSLATION_UNIT {\n",0x13,1,(FILE *)out);
    print_ast(out,(AST *)pQVar1->data);
    fwrite("\n} TRANSLATION_UNIT_END\n",0x18,1,(FILE *)out);
  }
  return;
}

Assistant:

void print_program_ast(FILE *out,struct Program *program)
{
	size_t i;
	struct Queue_Node *it;
	for(it=program->translation_units->first;it!=NULL;it=it->prev)
	{
		fprintf(out,"TRANSLATION_UNIT {\n");
		print_ast(out,(struct AST*)it->data);
		fprintf(out,"\n} TRANSLATION_UNIT_END\n");
	}
}